

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate_init.inc.c
# Opt level: O2

void spr_read_spefscr(DisasContext_conflict10 *ctx,int gprn,int sprn)

{
  TCGContext_conflict10 *tcg_ctx;
  TCGv_i32 ret;
  uintptr_t o;
  
  tcg_ctx = ctx->uc->tcg_ctx;
  ret = tcg_temp_new_i32(tcg_ctx);
  tcg_gen_ld_i32(tcg_ctx,ret,tcg_ctx->cpu_env,0x12f38);
  tcg_gen_extu_i32_i64_ppc64(tcg_ctx,cpu_gpr[gprn],ret);
  tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(ret + (long)tcg_ctx));
  return;
}

Assistant:

static void spr_read_spefscr(DisasContext *ctx, int gprn, int sprn)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv_i32 t0 = tcg_temp_new_i32(tcg_ctx);
    tcg_gen_ld_i32(tcg_ctx, t0, tcg_ctx->cpu_env, offsetof(CPUPPCState, spe_fscr));
    tcg_gen_extu_i32_tl(tcg_ctx, cpu_gpr[gprn], t0);
    tcg_temp_free_i32(tcg_ctx, t0);
}